

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexBuilder.cpp
# Opt level: O2

uint __thiscall ConvexBuilder::process(ConvexBuilder *this,DecompDesc *desc)

{
  float fVar1;
  uint uVar2;
  ChUll *this_00;
  bool bVar3;
  HullError HVar4;
  long lVar5;
  HullLibrary hl;
  HullResult result;
  HullDesc local_108;
  ConvexResult r;
  
  MAXDEPTH = *(uint *)(desc + 0x20);
  CONCAVE_PERCENT = *(float *)(desc + 0x24);
  MERGE_PERCENT = *(float *)(desc + 0x28);
  ConvexDecomposition::calcConvexDecomposition
            (*(uint *)desc,*(float **)(desc + 8),*(uint *)(desc + 0x10),*(uint **)(desc + 0x18),
             &this->super_ConvexDecompInterface,0.0,0);
  do {
    bVar3 = combineHulls(this);
  } while (bVar3);
  for (lVar5 = 0; uVar2 = (this->mChulls).m_size, lVar5 < (int)uVar2; lVar5 = lVar5 + 1) {
    this_00 = (ChUll *)(this->mChulls).m_data[lVar5];
    result.mPolygons = true;
    result.mNumIndices = 0;
    result.mIndices = (uint *)0x0;
    result.mNumOutputVertices = 0;
    result.mOutputVertices._0_4_ = 0;
    result.mOutputVertices._4_4_ = 0;
    result.mNumFaces = 0;
    local_108.mMaxFaces = 0x1000;
    local_108.mNormalEpsilon = 0.001;
    local_108.mSkinWidth = 0.01;
    local_108.mFlags = 1;
    local_108.mVertices = *(float **)(*(uint **)&this_00->mDiagonal + 2);
    local_108.mVertexStride = 0xc;
    local_108.mMaxVertices = *(uint *)(desc + 0x2c);
    fVar1 = *(float *)(desc + 0x30);
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      local_108.mSkinWidth = fVar1;
      local_108.mNormalEpsilon = 0.001;
      local_108.mFlags = 5;
    }
    local_108.mVcount = **(uint **)&this_00->mDiagonal;
    HVar4 = ConvexDecomposition::HullLibrary::CreateConvexHull(&hl,&local_108,&result);
    if (HVar4 == QE_OK) {
      ConvexDecomposition::ConvexResult::ConvexResult
                (&r,result.mNumOutputVertices,
                 (float *)CONCAT44(result.mOutputVertices._4_4_,result.mOutputVertices._0_4_),
                 result.mNumFaces,result.mIndices);
      r.mHullVolume =
           computeMeshVolume((float *)CONCAT44(result.mOutputVertices._4_4_,
                                               result.mOutputVertices._0_4_),result.mNumFaces,
                             result.mIndices);
      computeBestFitOBB(result.mNumOutputVertices,
                        (float *)CONCAT44(result.mOutputVertices._4_4_,result.mOutputVertices._0_4_)
                        ,0xc,r.mOBBSides,r.mOBBTransform);
      r.mOBBVolume = r.mOBBSides[0] * r.mOBBSides[1] * r.mOBBSides[2];
      fm_getTranslation(r.mOBBTransform,r.mOBBCenter);
      fm_matrixToQuat(r.mOBBTransform,r.mOBBOrientation);
      r.mSphereRadius =
           computeBoundingSphere
                     (result.mNumOutputVertices,
                      (float *)CONCAT44(result.mOutputVertices._4_4_,result.mOutputVertices._0_4_),
                      r.mSphereCenter);
      r.mSphereVolume = fm_sphereVolume(r.mSphereRadius);
      (*this->mCallback->_vptr_ConvexDecompInterface[6])(this->mCallback,&r);
      ConvexDecomposition::ConvexResult::~ConvexResult(&r);
    }
    ConvexDecomposition::HullLibrary::ReleaseResult(&hl,&result);
    ChUll::~ChUll(this_00);
    ::operator_delete(this_00,0x28);
  }
  cbtAlignedObjectArray<ChUll_*>::clear(&this->mChulls);
  return uVar2;
}

Assistant:

unsigned int ConvexBuilder::process(const DecompDesc &desc)
{

	unsigned int ret = 0;

	MAXDEPTH        = desc.mDepth;
	CONCAVE_PERCENT = desc.mCpercent;
	MERGE_PERCENT   = desc.mPpercent;


	calcConvexDecomposition(desc.mVcount, desc.mVertices, desc.mTcount, desc.mIndices,this,0,0);


	while ( combineHulls() ); // keep combining hulls until I can't combine any more...

	int i;
	for (i=0;i<mChulls.size();i++)
	{
		ChUll *cr = mChulls[i];

		// before we hand it back to the application, we need to regenerate the hull based on the
		// limits given by the user.

		const ConvexResult &c = *cr->mResult; // the high resolution hull...

		HullResult result;
		HullLibrary hl;
		HullDesc   hdesc;

		hdesc.SetHullFlag(QF_TRIANGLES);

		hdesc.mVcount       = c.mHullVcount;
		hdesc.mVertices     = c.mHullVertices;
		hdesc.mVertexStride = sizeof(float)*3;
		hdesc.mMaxVertices  = desc.mMaxVertices; // maximum number of vertices allowed in the output

		if ( desc.mSkinWidth  )
		{
			hdesc.mSkinWidth = desc.mSkinWidth;
			hdesc.SetHullFlag(QF_SKIN_WIDTH); // do skin width computation.
		}

		HullError ret = hl.CreateConvexHull(hdesc,result);

		if ( ret == QE_OK )
		{
			ConvexResult r(result.mNumOutputVertices, result.mOutputVertices, result.mNumFaces, result.mIndices);

			r.mHullVolume = computeMeshVolume( result.mOutputVertices, result.mNumFaces, result.mIndices ); // the volume of the hull.

			// compute the best fit OBB
			computeBestFitOBB( result.mNumOutputVertices, result.mOutputVertices, sizeof(float)*3, r.mOBBSides, r.mOBBTransform );

			r.mOBBVolume = r.mOBBSides[0] * r.mOBBSides[1] *r.mOBBSides[2]; // compute the OBB volume.

			fm_getTranslation( r.mOBBTransform, r.mOBBCenter );      // get the translation component of the 4x4 matrix.

			fm_matrixToQuat( r.mOBBTransform, r.mOBBOrientation );   // extract the orientation as a quaternion.

			r.mSphereRadius = computeBoundingSphere( result.mNumOutputVertices, result.mOutputVertices, r.mSphereCenter );
			r.mSphereVolume = fm_sphereVolume( r.mSphereRadius );


			mCallback->ConvexDecompResult(r);
		}

		hl.ReleaseResult (result);


		delete cr;
	}

	ret = mChulls.size();

	mChulls.clear();

	return ret;
}